

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall Dir::matchFiles(Dir *this,string *pattern)

{
  int iVar1;
  char *__pattern;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  dirent *ent;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  value_type *__x;
  allocator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_78 [32];
  string local_58 [48];
  dirent *local_28;
  undefined1 local_19;
  
  local_19 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2e1636);
  while (local_28 = readdir(*(DIR **)(in_RSI + 1)), local_28 != (dirent *)0x0) {
    __pattern = (char *)std::__cxx11::string::c_str();
    iVar1 = fnmatch(__pattern,local_28->d_name,0);
    if (iVar1 == 0) {
      std::operator+(in_RSI,(char *)in_RDI);
      __x = (value_type *)local_28->d_name;
      this_00 = (allocator *)&stack0xffffffffffffff67;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff68,(char *)__x,this_00);
      std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,__x);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
      std::__cxx11::string::~string(local_78);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> Dir::matchFiles(const std::string& pattern) {
  std::vector<std::string> result;
  struct dirent *ent;
  while ((ent = readdir(dir_)) != NULL) {
    if (fnmatch(pattern.c_str(), ent->d_name, 0) == 0) {
      result.push_back(path_ + "/" + std::string(ent->d_name));
    }
  }
  return result;
}